

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O2

double floor(double __x)

{
  HighsCDouble *in_RDI;
  double extraout_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  HighsCDouble HVar3;
  
  abs((int)in_RDI);
  dVar1 = in_RDI->hi + in_RDI->lo;
  if (1.0 <= in_XMM1_Qa + extraout_XMM0_Qa) {
    dVar2 = floor(dVar1);
    HVar3 = HighsCDouble::operator-(in_RDI,dVar2);
    dVar1 = floor(HVar3.hi + HVar3.lo);
    dVar2 = dVar2 + dVar1;
  }
  else if (0.0 <= dVar1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = -1.0;
  }
  return dVar2;
}

Assistant:

HighsCDouble floor(const HighsCDouble& x) {
    // Treat |x| < 1 as special case, as per (for example)
    // https://github.com/shibatch/tlfloat: see #2041
    if (abs(x) < 1) {
      if (x == 0 || x > 0) return HighsCDouble(0.0);
      return HighsCDouble(-1.0);
    }
    double floor_x = std::floor(double(x));
    HighsCDouble res;

    two_sum(res.hi, res.lo, floor_x, std::floor(double(x - floor_x)));
    return res;
  }